

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorResolveAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long local_68;
  long mindist;
  long dist;
  long ad;
  long bd;
  long gd;
  long rd;
  int local_30;
  int op;
  int ct;
  int c;
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  gdImagePtr im_local;
  
  local_30 = -1;
  rd._4_4_ = -1;
  local_68 = 0x3f804;
  if (im->trueColor == 0) {
    for (op = 0; op < im->colorsTotal; op = op + 1) {
      if (im->open[op] == 0) {
        if ((op != im->transparent) &&
           (lVar1 = (long)(im->red[op] - r), lVar2 = (long)(im->green[op] - g),
           lVar3 = (long)(im->blue[op] - b), lVar4 = (long)(im->alpha[op] - a),
           lVar1 = lVar1 * lVar1 + lVar2 * lVar2 + lVar3 * lVar3 + lVar4 * lVar4, lVar1 < local_68))
        {
          if (lVar1 == 0) {
            return op;
          }
          local_30 = op;
          local_68 = lVar1;
        }
      }
      else {
        rd._4_4_ = op;
      }
    }
    if (rd._4_4_ == -1) {
      rd._4_4_ = im->colorsTotal;
      if (rd._4_4_ == 0x100) {
        return local_30;
      }
      im->colorsTotal = im->colorsTotal + 1;
    }
    im->red[rd._4_4_] = r;
    im->green[rd._4_4_] = g;
    im->blue[rd._4_4_] = b;
    im->alpha[rd._4_4_] = a;
    im->open[rd._4_4_] = 0;
    im_local._4_4_ = rd._4_4_;
  }
  else {
    im_local._4_4_ = a * 0x1000000 + r * 0x10000 + g * 0x100 + b;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorResolveAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int c;
	int ct = -1;
	int op = -1;
	long rd, gd, bd, ad, dist;
	long mindist = 4 * 255 * 255;	/* init to max poss dist */
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}

	for (c = 0; c < im->colorsTotal; c++) {
		if (im->open[c]) {
			op = c;		/* Save open slot */
			continue;		/* Color not in use */
		}
		if (c == im->transparent) {
			/* don't ever resolve to the color that has
			 * been designated as the transparent color */
			continue;
		}
		rd = (long) (im->red[c] - r);
		gd = (long) (im->green[c] - g);
		bd = (long) (im->blue[c] - b);
		ad = (long) (im->alpha[c] - a);
		dist = rd * rd + gd * gd + bd * bd + ad * ad;
		if (dist < mindist) {
			if (dist == 0) {
				return c;		/* Return exact match color */
			}
			mindist = dist;
			ct = c;
		}
	}
	/* no exact match.  We now know closest, but first try to allocate exact */
	if (op == -1) {
		op = im->colorsTotal;
		if (op == gdMaxColors) {
			/* No room for more colors */
			return ct;		/* Return closest available color */
		}
		im->colorsTotal++;
	}
	im->red[op] = r;
	im->green[op] = g;
	im->blue[op] = b;
	im->alpha[op] = a;
	im->open[op] = 0;
	return op;			/* Return newly allocated color */
}